

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecond
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,
          TPZDohrMatrix<float,_TPZDohrSubstruct<float>_> *origin,
          TPZAutoPointer<TPZDohrAssembly<float>_> *assemble)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  int64_t iVar3;
  char cVar4;
  
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_01a0b420;
  iVar3 = (origin->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow =
       (origin->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = iVar3;
  cVar4 = (origin->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed =
       (origin->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = cVar4;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrPrecond_01a09a10;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
  ::list(&this->fGlobal,&origin->fGlobal);
  this->fCoarse = (TPZStepSolver<float> *)0x0;
  this->fNumCoarse = (long)origin->fNumCoarse;
  this->fNumThreads = 0;
  pTVar2 = assemble->fRef;
  (this->fAssemble).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  this->fNumThreads = origin->fNumThreads;
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(TPZDohrMatrix<TVar, TSubStruct> &origin, TPZAutoPointer<TPZDohrAssembly<TVar> > assemble)
: TPZMatrix<TVar>(origin), fGlobal(origin.SubStructures()), fCoarse(0), fNumCoarse(origin.NumCoarse()), fNumThreads(0), fAssemble(assemble)
{
	fNumThreads = origin.NumThreads();
}